

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O2

void __thiscall MyCompiler::Number::setNum(Number *this,int64_t val)

{
  uint *puVar1;
  ostringstream out;
  string local_1b0 [32];
  long local_190 [3];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 & 0xfffffdff;
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 2;
  std::ostream::_M_insert<long>((long)local_190);
  this->num = val;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&(this->super_AbstractAstNode).value,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void MyCompiler::Number::setNum(int64_t val)
{
    std::ostringstream out;
    out << std::noshowbase << std::setbase(10) << val;
    num = val;
    value = out.str();
}